

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputScalar
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *p_data,char *format,
               void *p_clamp_min,void *p_clamp_max)

{
  ImGuiContext_conflict *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *format_00;
  ImGuiDataTypeInfo *pIVar5;
  undefined1 local_a0 [8];
  ImGuiDataTypeTempStorage data_backup;
  size_t data_type_size;
  char local_88 [3];
  bool value_changed;
  ImGuiInputTextFlags flags;
  char data_buf [32];
  char fmt_buf [32];
  ImGuiContext *g;
  char *format_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  format_00 = ImParseFormatTrimDecorations(format,data_buf + 0x18,0x20);
  DataTypeFormatString(local_88,0x20,data_type,p_data,format_00);
  ImStrTrimBlanks(local_88);
  uVar3 = 1;
  if (data_type == 8 || data_type == 9) {
    uVar3 = 0x20000;
  }
  data_type_size._3_1_ = false;
  bVar2 = TempInputText(bb,id,label,local_88,0x20,uVar3 | 0x8000010);
  if (bVar2) {
    pIVar5 = DataTypeGetInfo(data_type);
    data_backup.Data = (ImU8  [8])pIVar5->Size;
    memcpy(local_a0,p_data,(size_t)data_backup.Data);
    DataTypeApplyOpFromText
              (local_88,(pIVar1->InputTextState).InitialTextA.Data,data_type,p_data,(char *)0x0);
    if ((p_clamp_min != (void *)0x0) || (p_clamp_max != (void *)0x0)) {
      if ((p_clamp_min != (void *)0x0) &&
         ((p_clamp_max != (void *)0x0 &&
          (iVar4 = DataTypeCompare(data_type,p_clamp_min,p_clamp_max), 0 < iVar4)))) {
        ImSwap<void_const*>(&p_clamp_min,&p_clamp_max);
      }
      DataTypeClamp(data_type,p_data,p_clamp_min,p_clamp_max);
    }
    iVar4 = memcmp(local_a0,p_data,(size_t)data_backup.Data);
    data_type_size._3_1_ = iVar4 != 0;
    if (data_type_size._3_1_) {
      MarkItemEdited(id);
    }
  }
  return data_type_size._3_1_;
}

Assistant:

bool ImGui::TempInputScalar(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* p_data, const char* format, const void* p_clamp_min, const void* p_clamp_max)
{
    ImGuiContext& g = *GImGui;

    char fmt_buf[32];
    char data_buf[32];
    format = ImParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, p_data, format);
    ImStrTrimBlanks(data_buf);

    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ImGuiInputTextFlags_NoMarkEdited;
    flags |= ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = false;
    if (TempInputText(bb, id, label, data_buf, IM_ARRAYSIZE(data_buf), flags))
    {
        // Backup old value
        size_t data_type_size = DataTypeGetInfo(data_type)->Size;
        ImGuiDataTypeTempStorage data_backup;
        memcpy(&data_backup, p_data, data_type_size);

        // Apply new value (or operations) then clamp
        DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialTextA.Data, data_type, p_data, NULL);
        if (p_clamp_min || p_clamp_max)
        {
            if (p_clamp_min && p_clamp_max && DataTypeCompare(data_type, p_clamp_min, p_clamp_max) > 0)
                ImSwap(p_clamp_min, p_clamp_max);
            DataTypeClamp(data_type, p_data, p_clamp_min, p_clamp_max);
        }

        // Only mark as edited if new value is different
        value_changed = memcmp(&data_backup, p_data, data_type_size) != 0;
        if (value_changed)
            MarkItemEdited(id);
    }
    return value_changed;
}